

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdtrans.c
# Opt level: O0

jvirt_barray_ptr * jpeg_read_coefficients(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  int retcode;
  j_decompress_ptr cinfo_local;
  
  if (cinfo->global_state == 0xca) {
    transdecode_master_selection(cinfo);
    cinfo->global_state = 0xd1;
  }
  if (cinfo->global_state == 0xd1) {
    while( true ) {
      if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
        (*cinfo->progress->progress_monitor)((j_common_ptr)cinfo);
      }
      iVar1 = (*cinfo->inputctl->consume_input)(cinfo);
      if (iVar1 == 0) {
        return (jvirt_barray_ptr *)0x0;
      }
      if (iVar1 == 2) break;
      if ((cinfo->progress != (jpeg_progress_mgr *)0x0) &&
         (((iVar1 == 3 || (iVar1 == 1)) &&
          (lVar2 = cinfo->progress->pass_counter + 1, cinfo->progress->pass_counter = lVar2,
          cinfo->progress->pass_limit <= lVar2)))) {
        cinfo->progress->pass_limit = (ulong)cinfo->total_iMCU_rows + cinfo->progress->pass_limit;
      }
    }
    cinfo->global_state = 0xd2;
  }
  if (((cinfo->global_state == 0xd2) || (cinfo->global_state == 0xcf)) &&
     (cinfo->buffered_image != 0)) {
    cinfo_local = (j_decompress_ptr)cinfo->coef->coef_arrays;
  }
  else {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    cinfo_local = (j_decompress_ptr)0x0;
  }
  return (jvirt_barray_ptr *)cinfo_local;
}

Assistant:

GLOBAL(jvirt_barray_ptr *)
jpeg_read_coefficients (j_decompress_ptr cinfo)
{
  if (cinfo->global_state == DSTATE_READY) {
    /* First call: initialize active modules */
    transdecode_master_selection(cinfo);
    cinfo->global_state = DSTATE_RDCOEFS;
  }
  if (cinfo->global_state == DSTATE_RDCOEFS) {
    /* Absorb whole file into the coef buffer */
    for (;;) {
      int retcode;
      /* Call progress monitor hook if present */
      if (cinfo->progress != NULL)
	(*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
      /* Absorb some more input */
      retcode = (*cinfo->inputctl->consume_input) (cinfo);
      if (retcode == JPEG_SUSPENDED)
	return NULL;
      if (retcode == JPEG_REACHED_EOI)
	break;
      /* Advance progress counter if appropriate */
      if (cinfo->progress != NULL &&
	  (retcode == JPEG_ROW_COMPLETED || retcode == JPEG_REACHED_SOS)) {
	if (++cinfo->progress->pass_counter >= cinfo->progress->pass_limit) {
	  /* startup underestimated number of scans; ratchet up one scan */
	  cinfo->progress->pass_limit += (long) cinfo->total_iMCU_rows;
	}
      }
    }
    /* Set state so that jpeg_finish_decompress does the right thing */
    cinfo->global_state = DSTATE_STOPPING;
  }
  /* At this point we should be in state DSTATE_STOPPING if being used
   * standalone, or in state DSTATE_BUFIMAGE if being invoked to get access
   * to the coefficients during a full buffered-image-mode decompression.
   */
  if ((cinfo->global_state == DSTATE_STOPPING ||
       cinfo->global_state == DSTATE_BUFIMAGE) && cinfo->buffered_image) {
    return cinfo->coef->coef_arrays;
  }
  /* Oops, improper usage */
  ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  return NULL;			/* keep compiler happy */
}